

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

bool Imath_2_5::anon_unknown_18::twoSidedJacobiRotation<float>
               (Matrix44<float> *A,int j,int k,Matrix44<float> *U,Matrix44<float> *V,float tol)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int l;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float p;
  float fVar13;
  float fVar14;
  float r;
  
  uVar8 = (ulong)(uint)j;
  fVar1 = A->x[j][uVar8];
  uVar9 = (ulong)(uint)k;
  fVar2 = A->x[j][uVar9];
  fVar3 = A->x[k][uVar8];
  fVar4 = A->x[k][uVar9];
  bVar6 = ABS(fVar1 + fVar4) * tol < ABS(fVar2 - fVar3);
  if (bVar6) {
    fVar13 = (fVar1 + fVar4) / (fVar2 - fVar3);
    fVar10 = fVar13 * fVar13 + 1.0;
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    fVar14 = (float)(-(uint)(fVar13 < 0.0) & (uint)-(1.0 / fVar10) |
                    ~-(uint)(fVar13 < 0.0) & (uint)(1.0 / fVar10));
    fVar13 = fVar13 * fVar14;
    fVar12 = (fVar2 + fVar3) * fVar14 + (fVar4 - fVar1) * fVar13;
    fVar10 = fVar13 * fVar2 - fVar14 * fVar4;
    fVar10 = fVar10 + fVar10;
  }
  else {
    fVar12 = fVar4 - fVar1;
    fVar10 = fVar2 + fVar3;
    fVar13 = 1.0;
    fVar14 = 0.0;
  }
  if (ABS(fVar10) <= ABS(fVar12) * tol) {
    fVar10 = 1.0;
    fVar12 = 0.0;
  }
  else {
    fVar12 = fVar12 / fVar10;
    fVar10 = fVar12 * fVar12 + 1.0;
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    fVar10 = 1.0 / (ABS(fVar12) + fVar10);
    fVar12 = (float)(-(uint)(fVar12 < 0.0) & (uint)-fVar10 | ~-(uint)(fVar12 < 0.0) & (uint)fVar10);
    fVar10 = fVar12 * fVar12 + 1.0;
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    fVar10 = 1.0 / fVar10;
    fVar12 = fVar10 * fVar12;
    bVar6 = true;
  }
  if (bVar6 == false) {
    A->x[k][uVar8] = 0.0;
    A->x[j][uVar9] = 0.0;
  }
  else {
    fVar11 = fVar10 * fVar13 - fVar14 * fVar12;
    fVar14 = fVar13 * fVar12 + fVar14 * fVar10;
    A->x[j][uVar8] =
         (fVar1 * fVar10 - fVar12 * fVar2) * fVar11 - (fVar3 * fVar10 - fVar12 * fVar4) * fVar14;
    A->x[k][uVar9] =
         (fVar1 * fVar12 + fVar2 * fVar10) * fVar14 + (fVar3 * fVar12 + fVar4 * fVar10) * fVar11;
    uVar5 = 0;
    A->x[k][uVar8] = 0.0;
    A->x[j][uVar9] = 0.0;
    do {
      if (uVar9 != uVar5 && uVar8 != uVar5) {
        fVar1 = A->x[j][uVar5];
        fVar2 = A->x[k][uVar5];
        A->x[j][uVar5] = fVar11 * fVar1 + fVar2 * -fVar14;
        A->x[k][uVar5] = fVar1 * fVar14 + fVar2 * fVar11;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
    lVar7 = 0;
    do {
      if (uVar9 << 4 != lVar7 && uVar8 << 4 != lVar7) {
        fVar1 = *(float *)((long)A->x[0] + lVar7 + uVar8 * 4);
        fVar2 = *(float *)((long)A->x[0] + lVar7 + uVar9 * 4);
        *(float *)((long)A->x[0] + lVar7 + uVar8 * 4) = fVar10 * fVar1 + fVar2 * -fVar12;
        *(float *)((long)A->x[0] + lVar7 + uVar9 * 4) = fVar1 * fVar12 + fVar2 * fVar10;
      }
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
    lVar7 = 0;
    do {
      fVar1 = *(float *)((long)U->x[0] + lVar7 + uVar8 * 4);
      fVar2 = *(float *)((long)U->x[0] + lVar7 + uVar9 * 4);
      *(float *)((long)U->x[0] + lVar7 + uVar8 * 4) = fVar11 * fVar1 - fVar14 * fVar2;
      *(float *)((long)U->x[0] + lVar7 + uVar9 * 4) = fVar1 * fVar14 + fVar2 * fVar11;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
    lVar7 = 0;
    do {
      fVar1 = *(float *)((long)V->x[0] + lVar7 + uVar8 * 4);
      fVar2 = *(float *)((long)V->x[0] + lVar7 + uVar9 * 4);
      *(float *)((long)V->x[0] + lVar7 + uVar8 * 4) = fVar10 * fVar1 - fVar12 * fVar2;
      *(float *)((long)V->x[0] + lVar7 + uVar9 * 4) = fVar1 * fVar12 + fVar2 * fVar10;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
  }
  return bVar6;
}

Assistant:

bool
twoSidedJacobiRotation (IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
                        int j,
                        int k,
                        IMATH_INTERNAL_NAMESPACE::Matrix44<T>& U,
                        IMATH_INTERNAL_NAMESPACE::Matrix44<T>& V,
                        const T tol)
{
    // Load everything into local variables to make things easier on the
    // optimizer:
    const T w = A[j][j];
    const T x = A[j][k];
    const T y = A[k][j];
    const T z = A[k][k];

    // We will keep track of whether we're actually performing any rotations,
    // since if the matrix is already diagonal we'll end up with the identity
    // as our Jacobi rotation and we can short-circuit.
    bool changed = false;

    // The first step is to symmetrize the 2x2 matrix,
    //   [ c  s ]^T [ w x ] = [ p q ]
    //   [ -s c ]   [ y z ]   [ q r ]
    T mu_1 = w + z;
    T mu_2 = x - y;

    T c, s;
    if (std::abs(mu_2) <= tol*std::abs(mu_1))  // Already symmetric (to tolerance)
    {                                          // Note that the <= is important here
        c = T(1);                              // because we want to bypass the computation
        s = T(0);                              // of rho if mu_1 = mu_2 = 0.

        const T p = w;
        const T r = z;
        mu_1 = r - p;
        mu_2 = x + y;
    }
    else
    {
        const T rho = mu_1 / mu_2;
        s = T(1) / std::sqrt (T(1) + rho*rho);  // TODO is there a native inverse square root function?
        if (rho < 0)
            s = -s;
        c = s * rho;

        mu_1 = s * (x + y) + c * (z - w);   // = r - p
        mu_2 = T(2) * (c * x - s * z);      // = 2*q

        changed = true;
    }

    // The second stage diagonalizes,
    //   [ c2   s2 ]^T [ p q ] [ c2  s2 ]  = [ d1   0 ]
    //   [ -s2  c2 ]   [ q r ] [ -s2 c2 ]    [  0  d2 ]
    T c_2, s_2;
    if (std::abs(mu_2) <= tol*std::abs(mu_1))
    {
       c_2 = T(1);
       s_2 = T(0);
    }
    else
    {
        const T rho_2 = mu_1 / mu_2;
        T t_2 = T(1) / (std::abs(rho_2) + std::sqrt(1 + rho_2*rho_2));
        if (rho_2 < 0)
            t_2 = -t_2;
        c_2 = T(1) / std::sqrt (T(1) + t_2*t_2);
        s_2 = c_2 * t_2;

        changed = true;
    }

    const T c_1 = c_2 * c - s_2 * s;
    const T s_1 = s_2 * c + c_2 * s;

    if (!changed)
    {
        // We've decided that the off-diagonal entries are already small
        // enough, so we'll set them to zero.  This actually appears to result
        // in smaller errors than leaving them be, possibly because it prevents
        // us from trying to do extra rotations later that we don't need.
        A[k][j] = 0;
        A[j][k] = 0;
        return false;
    }

    const T d_1 = c_1*(w*c_2 - x*s_2) - s_1*(y*c_2 - z*s_2);
    const T d_2 = s_1*(w*s_2 + x*c_2) + c_1*(y*s_2 + z*c_2);

    // For the entries we just zeroed out, we'll just set them to 0, since
    // they should be 0 up to machine precision.  
    A[j][j] = d_1;
    A[k][k] = d_2;
    A[k][j] = 0;
    A[j][k] = 0;

    // Rotate the entries that _weren't_ involved in the 2x2 SVD:
    for (int l = 0; l < 4; ++l)
    {
        if (l == j || l == k)
            continue;

        // Rotate on the left by
        //    [ 1               ]
        //    [   .             ]
        //    [     c2   s2     ]  j
        //    [        1        ]
        //    [    -s2   c2     ]  k
        //    [             .   ]
        //    [               1 ]
        //          j    k
        //
        // This has the effect of adding the (weighted) ith and jth _rows_ to
        // each other.  
        const T tau1 = A[j][l];
        const T tau2 = A[k][l];
        A[j][l] = c_1 * tau1 - s_1 * tau2;
        A[k][l] = s_1 * tau1 + c_1 * tau2;
    }

    for (int l = 0; l < 4; ++l)
    {
        // We set the A[j/k][j/k] entries already
        if (l == j || l == k)
            continue;

        // Rotate on the right by
        //    [ 1               ]
        //    [   .             ]
        //    [     c2   s2     ]  j
        //    [        1        ]
        //    [    -s2   c2     ]  k
        //    [             .   ]
        //    [               1 ]
        //          j    k
        //
        // This has the effect of adding the (weighted) ith and jth _columns_ to
        // each other.  
        const T tau1 = A[l][j];
        const T tau2 = A[l][k];
        A[l][j] = c_2 * tau1 - s_2 * tau2;
        A[l][k] = s_2 * tau1 + c_2 * tau2;
    }

    // Now apply the rotations to U and V:
    // Remember that we have 
    //    R1^T * A * R2 = D
    // This is in the 2x2 case, but after doing a bunch of these
    // we will get something like this for the 3x3 case:
    //   ... R1b^T * R1a^T * A * R2a * R2b * ... = D
    //   -----------------       ---------------
    //        = U^T                    = V
    // So,
    //   U = R1a * R1b * ...
    //   V = R2a * R2b * ...
    jacobiRotateRight (U, j, k, c_1, s_1);
    jacobiRotateRight (V, j, k, c_2, s_2);

    return true;
}